

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

void __thiscall
flatbuffers::dart::DartGenerator::StructBuilderBody
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FieldDef *pFVar3;
  Namespace *current_namespace;
  long *plVar4;
  size_type *psVar5;
  pointer ppVar6;
  string field_name;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  DartGenerator *local_a8;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  StructDef *local_38;
  
  local_a8 = this;
  local_38 = struct_def;
  std::__cxx11::string::append((char *)code);
  ppVar6 = (non_deprecated_fields->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = non_deprecated_fields;
  if (ppVar6 != (non_deprecated_fields->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    pIVar1 = &local_a8->namer_;
    do {
      pFVar3 = ppVar6->second;
      (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_98,pIVar1,pFVar3);
      if (((pFVar3->value).type.base_type == BASE_TYPE_STRUCT) &&
         (((pFVar3->value).type.struct_def)->fixed == true)) {
        std::__cxx11::string::append((char *)code);
      }
      else {
        current_namespace = (local_38->super_Definition).defined_namespace;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
        GenDartTypeName(&local_e8,local_a8,&(pFVar3->value).type,current_namespace,pFVar3,&local_58)
        ;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      std::operator+(&local_e8," ",&local_98);
      std::__cxx11::string::_M_append((char *)code,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (ppVar6 != (local_a0->
                    super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1) {
        std::__cxx11::string::append((char *)code);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != (local_a0->
                       super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)code);
  ppVar6 = (local_a0->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != (local_a0->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    pIVar1 = &local_a8->namer_;
    paVar2 = &local_e8.field_2;
    do {
      pFVar3 = ppVar6[-1].second;
      (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_98,pIVar1,pFVar3);
      if (pFVar3->padding != 0) {
        NumToString<unsigned_long>(&local_78,pFVar3->padding);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x366b4b);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_c8.field_2._M_allocated_capacity = *psVar5;
          local_c8.field_2._8_8_ = plVar4[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar5;
          local_c8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_e8.field_2._M_allocated_capacity = *psVar5;
          local_e8.field_2._8_8_ = plVar4[3];
          local_e8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar5;
          local_e8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_e8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (((pFVar3->value).type.base_type == BASE_TYPE_STRUCT) &&
         (((pFVar3->value).type.struct_def)->fixed == true)) {
        std::operator+(&local_c8,"    ",&local_98);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_e8.field_2._M_allocated_capacity = *psVar5;
          local_e8.field_2._8_8_ = plVar4[3];
          local_e8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar5;
          local_e8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_e8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        GenType_abi_cxx11_(&local_78,local_a8,&(pFVar3->value).type);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x366b5e);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_c8.field_2._M_allocated_capacity = *psVar5;
          local_c8.field_2._8_8_ = plVar4[3];
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar5;
          local_c8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_e8.field_2._M_allocated_capacity = *psVar5;
          local_e8.field_2._8_8_ = plVar4[3];
          local_e8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar5;
          local_e8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_e8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)code,(ulong)local_98._M_dataplus._M_p);
        if ((pFVar3->value).type.enum_def != (EnumDef *)0x0) {
          std::__cxx11::string::append((char *)code);
        }
        std::__cxx11::string::append((char *)code);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      ppVar6 = ppVar6 + -1;
    } while (ppVar6 != (local_a0->
                       super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  return;
}

Assistant:

void StructBuilderBody(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    code += "  int finish(";
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;
      const std::string field_name = namer_.Field(field);

      if (IsStruct(field.value.type)) {
        code += "fb.StructBuilder";
      } else {
        code += GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field);
      }
      code += " " + field_name;
      if (it != non_deprecated_fields.end() - 1) { code += ", "; }
    }
    code += ") {\n";

    for (auto it = non_deprecated_fields.rbegin();
         it != non_deprecated_fields.rend(); ++it) {
      const FieldDef &field = *it->second;
      const std::string field_name = namer_.Field(field);

      if (field.padding) {
        code += "    fbBuilder.pad(" + NumToString(field.padding) + ");\n";
      }

      if (IsStruct(field.value.type)) {
        code += "    " + field_name + "();\n";
      } else {
        code += "    fbBuilder.put" + GenType(field.value.type) + "(";
        code += field_name;
        if (field.value.type.enum_def) { code += ".value"; }
        code += ");\n";
      }
    }
    code += "    return fbBuilder.offset;\n";
    code += "  }\n\n";
  }